

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d8_h4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  short sVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar18;
  undefined1 auVar17 [16];
  __m128i ss_3_1;
  __m128i d2;
  __m128i d1;
  __m128i ss_4;
  __m128i ss_4_2;
  __m128i ss_4_1;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i max;
  uint i;
  __m128i srcReg32b2;
  __m128i srcReg32b1;
  __m128i srcRegFilt32b1_2;
  __m128i srcRegFilt32b1_1;
  __m128i thirdFilters;
  __m128i secondFilters;
  __m128i addFilterReg64;
  __m128i filtersReg;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_478;
  undefined8 local_468;
  int local_41c;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3c8;
  undefined8 *local_378;
  long local_368;
  undefined4 uStack_2cc;
  undefined4 uStack_2c0;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  __m128i res_hi_1;
  __m128i res_lo_1;
  __m128i ss_5;
  __m128i ss_3;
  __m128i ss_5_2;
  __m128i ss_3_2;
  __m128i ss_5_1;
  
  local_368 = in_RDI + -6;
  uVar3 = in_R9[1];
  sVar12 = (short)(1 << ((byte)ss_3_1[1] & 0x1f)) + -1;
  uVar18 = (undefined4)((ulong)*in_R9 >> 0x20);
  uStack_2c0 = (undefined4)uVar3;
  uStack_2cc = (undefined4)((ulong)uVar3 >> 0x20);
  auVar1._4_8_ = uVar3;
  auVar1._0_4_ = uVar18;
  auVar15._0_8_ = auVar1._0_8_ << 0x20;
  auVar15._8_4_ = uStack_2c0;
  auVar15._12_4_ = uStack_2cc;
  uStack_2b4 = (undefined4)*in_R9;
  auVar2._4_8_ = auVar15._8_8_;
  auVar2._0_4_ = uStack_2b4;
  auVar17._0_8_ = auVar2._0_8_ << 0x20;
  auVar17._8_4_ = uStack_2b0;
  auVar17._12_4_ = uVar18;
  uVar3 = CONCAT44(uStack_2c0,uStack_2c0);
  local_378 = in_RDX;
  for (local_41c = in_R8D; local_41c != 0; local_41c = local_41c + -1) {
    pauVar13 = (undefined1 (*) [16])(local_368 + 4);
    pauVar14 = (undefined1 (*) [16])(local_368 + 0xc);
    local_468 = SUB168(*pauVar13,4);
    local_478 = SUB168(*pauVar14,4);
    auVar9._8_8_ = auVar17._8_8_;
    auVar9._0_8_ = local_3c8;
    auVar15 = pmaddwd(*pauVar13,auVar9);
    auVar8._8_8_ = local_478;
    auVar8._0_8_ = local_468;
    auVar7._8_8_ = uVar3;
    auVar7._0_8_ = uVar3;
    auVar16 = pmaddwd(auVar8,auVar7);
    local_128 = auVar15._0_4_;
    iStack_124 = auVar15._4_4_;
    iStack_120 = auVar15._8_4_;
    iStack_11c = auVar15._12_4_;
    local_138 = auVar16._0_4_;
    iStack_134 = auVar16._4_4_;
    iStack_130 = auVar16._8_4_;
    iStack_12c = auVar16._12_4_;
    local_4b8 = SUB168(*pauVar13,2);
    local_4d8 = SUB168(*pauVar14,2);
    local_4c8 = SUB168(*pauVar13,6);
    local_4e8 = SUB168(*pauVar14,6);
    auVar6._8_8_ = local_4d8;
    auVar6._0_8_ = local_4b8;
    auVar5._8_8_ = auVar17._8_8_;
    auVar5._0_8_ = local_3c8;
    auVar15 = pmaddwd(auVar6,auVar5);
    auVar4._8_8_ = local_4e8;
    auVar4._0_8_ = local_4c8;
    auVar16._8_8_ = uVar3;
    auVar16._0_8_ = uVar3;
    auVar16 = pmaddwd(auVar4,auVar16);
    local_148 = auVar15._0_4_;
    iStack_144 = auVar15._4_4_;
    iStack_140 = auVar15._8_4_;
    iStack_13c = auVar15._12_4_;
    local_158 = auVar16._0_4_;
    iStack_154 = auVar16._4_4_;
    iStack_150 = auVar16._8_4_;
    iStack_14c = auVar16._12_4_;
    auVar15 = ZEXT416(7);
    auVar16 = ZEXT416(7);
    auVar11._4_4_ = local_148 + local_158 + 0x40 >> auVar15;
    auVar11._0_4_ = local_128 + local_138 + 0x40 >> auVar15;
    auVar11._12_4_ = iStack_144 + iStack_154 + 0x40 >> auVar15;
    auVar11._8_4_ = iStack_124 + iStack_134 + 0x40 >> auVar15;
    auVar10._4_4_ = iStack_140 + iStack_150 + 0x40 >> auVar16;
    auVar10._0_4_ = iStack_120 + iStack_130 + 0x40 >> auVar16;
    auVar10._12_4_ = iStack_13c + iStack_14c + 0x40 >> auVar16;
    auVar10._8_4_ = iStack_11c + iStack_12c + 0x40 >> auVar16;
    auVar15 = packssdw(auVar11,auVar10);
    local_a8 = auVar15._0_2_;
    sStack_a6 = auVar15._2_2_;
    sStack_a4 = auVar15._4_2_;
    sStack_a2 = auVar15._6_2_;
    sStack_a0 = auVar15._8_2_;
    sStack_9e = auVar15._10_2_;
    sStack_9c = auVar15._12_2_;
    sStack_9a = auVar15._14_2_;
    local_a8 = (ushort)(-1 < local_a8) * local_a8;
    sStack_a6 = (ushort)(-1 < sStack_a6) * sStack_a6;
    sStack_a4 = (ushort)(-1 < sStack_a4) * sStack_a4;
    sStack_a2 = (ushort)(-1 < sStack_a2) * sStack_a2;
    sStack_a0 = (ushort)(-1 < sStack_a0) * sStack_a0;
    sStack_9e = (ushort)(-1 < sStack_9e) * sStack_9e;
    sStack_9c = (ushort)(-1 < sStack_9c) * sStack_9c;
    sStack_9a = (ushort)(-1 < sStack_9a) * sStack_9a;
    local_3e8._0_4_ =
         CONCAT22((ushort)(sVar12 < sStack_a6) * sVar12 | (ushort)(sVar12 >= sStack_a6) * sStack_a6,
                  (ushort)(sVar12 < local_a8) * sVar12 | (ushort)(sVar12 >= local_a8) * local_a8);
    local_3e8._0_6_ =
         CONCAT24((ushort)(sVar12 < sStack_a4) * sVar12 | (ushort)(sVar12 >= sStack_a4) * sStack_a4,
                  (undefined4)local_3e8);
    local_3e8 = CONCAT26((ushort)(sVar12 < sStack_a2) * sVar12 |
                         (ushort)(sVar12 >= sStack_a2) * sStack_a2,(undefined6)local_3e8);
    uStack_3e0._0_2_ =
         (ushort)(sVar12 < sStack_a0) * sVar12 | (ushort)(sVar12 >= sStack_a0) * sStack_a0;
    uStack_3e0._2_2_ =
         (ushort)(sVar12 < sStack_9e) * sVar12 | (ushort)(sVar12 >= sStack_9e) * sStack_9e;
    uStack_3e0._4_2_ =
         (ushort)(sVar12 < sStack_9c) * sVar12 | (ushort)(sVar12 >= sStack_9c) * sStack_9c;
    uStack_3e0._6_2_ =
         (ushort)(sVar12 < sStack_9a) * sVar12 | (ushort)(sVar12 >= sStack_9a) * sStack_9a;
    local_368 = in_RSI * 2 + local_368;
    *local_378 = local_3e8;
    local_378[1] = uStack_3e0;
    local_378 = (undefined8 *)(CONCAT71(in_register_00000009,in_CL) * 2 + (long)local_378);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i addFilterReg64;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1, srcRegFilt32b1_2;
  __m128i srcReg32b1, srcReg32b2;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  const __m128i max = _mm_set1_epi16((1 << bd) - 1);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp_0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp_1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp_0, tmp_0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp_1, tmp_1);   // coeffs 4 5 4 5 4 5 4 5

  for (i = height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)(src_ptr + 2));
    srcReg32b2 = _mm_loadu_si128((const __m128i *)(src_ptr + 6));

    __m128i ss_4_1 = _mm_srli_si128(srcReg32b1, 4);
    __m128i ss_4_2 = _mm_srli_si128(srcReg32b2, 4);
    __m128i ss_4 = _mm_unpacklo_epi64(ss_4_1, ss_4_2);

    __m128i d1 = _mm_madd_epi16(srcReg32b1, secondFilters);
    __m128i d2 = _mm_madd_epi16(ss_4, thirdFilters);
    srcRegFilt32b1_1 = _mm_add_epi32(d1, d2);

    __m128i ss_3_1 = _mm_srli_si128(srcReg32b1, 2);
    __m128i ss_5_1 = _mm_srli_si128(srcReg32b1, 6);
    __m128i ss_3_2 = _mm_srli_si128(srcReg32b2, 2);
    __m128i ss_5_2 = _mm_srli_si128(srcReg32b2, 6);
    __m128i ss_3 = _mm_unpacklo_epi64(ss_3_1, ss_3_2);
    __m128i ss_5 = _mm_unpacklo_epi64(ss_5_1, ss_5_2);

    d1 = _mm_madd_epi16(ss_3, secondFilters);
    d2 = _mm_madd_epi16(ss_5, thirdFilters);
    srcRegFilt32b1_2 = _mm_add_epi32(d1, d2);

    __m128i res_lo_1 = _mm_unpacklo_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);
    __m128i res_hi_1 = _mm_unpackhi_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);

    // shift by 7 bit each 32 bit
    res_lo_1 = _mm_add_epi32(res_lo_1, addFilterReg64);
    res_hi_1 = _mm_add_epi32(res_hi_1, addFilterReg64);
    res_lo_1 = _mm_srai_epi32(res_lo_1, 7);
    res_hi_1 = _mm_srai_epi32(res_hi_1, 7);

    srcRegFilt32b1_1 = _mm_packs_epi32(res_lo_1, res_hi_1);

    srcRegFilt32b1_1 = _mm_max_epi16(srcRegFilt32b1_1, _mm_setzero_si128());
    srcRegFilt32b1_1 = _mm_min_epi16(srcRegFilt32b1_1, max);

    src_ptr += src_pitch;

    _mm_store_si128((__m128i *)dst_ptr, srcRegFilt32b1_1);

    dst_ptr += dst_pitch;
  }
}